

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

GRULayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_gru(NeuralNetworkLayer *this)

{
  bool bVar1;
  GRULayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_gru(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_gru(this);
    this_00 = (GRULayerParams *)operator_new(0x88);
    GRULayerParams::GRULayerParams(this_00);
    (this->layer_).gru_ = this_00;
  }
  return (GRULayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GRULayerParams* NeuralNetworkLayer::mutable_gru() {
  if (!has_gru()) {
    clear_layer();
    set_has_gru();
    layer_.gru_ = new ::CoreML::Specification::GRULayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.gru)
  return layer_.gru_;
}